

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void move_pending_to_connect(Curl_multi *multi,Curl_easy *data)

{
  curltime cVar1;
  curltime local_28;
  
  Curl_node_remove(&data->multi_queue);
  Curl_llist_append(&multi->process,data,&data->multi_queue);
  if (data->mstate != MSTATE_CONNECT) {
    data->mstate = MSTATE_CONNECT;
    Curl_init_CONNECT(data);
  }
  cVar1 = Curl_now();
  local_28.tv_sec = cVar1.tv_sec;
  local_28.tv_usec = cVar1.tv_usec;
  Curl_expire_ex(data,&local_28,0,EXPIRE_RUN_NOW);
  return;
}

Assistant:

static void move_pending_to_connect(struct Curl_multi *multi,
                                    struct Curl_easy *data)
{
  DEBUGASSERT(data->mstate == MSTATE_PENDING);

  /* Remove this node from the pending list */
  Curl_node_remove(&data->multi_queue);

  /* put it into the process list */
  Curl_llist_append(&multi->process, data, &data->multi_queue);

  multistate(data, MSTATE_CONNECT);

  /* Make sure that the handle will be processed soonish. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);
}